

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O3

int BN_print(void *fp,BIGNUM *a)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int j;
  long lVar7;
  
  if (a->neg == 0) {
LAB_001c7070:
    iVar3 = BN_is_zero((BIGNUM *)a);
    if (iVar3 != 0) {
      iVar3 = BIO_write((BIO *)fp,"0",1);
      if (iVar3 != 1) goto LAB_001c710c;
    }
    uVar4 = bn_minimal_width((BIGNUM *)a);
    iVar3 = 1;
    if (0 < (int)uVar4) {
      bVar2 = false;
      uVar6 = (ulong)uVar4;
      do {
        lVar7 = 0x3c;
        do {
          uVar5 = (ulong)((uint)(a->d[uVar6 - 1] >> ((byte)lVar7 & 0x3f)) & 0xf);
          if ((bVar2) || (bVar2 = false, uVar5 != 0)) {
            bVar2 = true;
            iVar3 = BIO_write((BIO *)fp,"0123456789abcdef" + uVar5,1);
            if (iVar3 != 1) goto LAB_001c710c;
          }
          lVar7 = lVar7 + -4;
        } while (lVar7 != -4);
        bVar1 = 1 < (long)uVar6;
        uVar6 = uVar6 - 1;
      } while (bVar1);
      iVar3 = 1;
    }
  }
  else {
    iVar3 = BIO_write((BIO *)fp,"-",1);
    if (iVar3 == 1) goto LAB_001c7070;
LAB_001c710c:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int BN_print(BIO *bp, const BIGNUM *a) {
  if (a->neg && BIO_write(bp, "-", 1) != 1) {
    return 0;
  }

  if (BN_is_zero(a) && BIO_write(bp, "0", 1) != 1) {
    return 0;
  }

  int z = 0;
  for (int i = bn_minimal_width(a) - 1; i >= 0; i--) {
    for (int j = BN_BITS2 - 4; j >= 0; j -= 4) {
      // strip leading zeros
      int v = ((int)(a->d[i] >> (long)j)) & 0x0f;
      if (z || v != 0) {
        if (BIO_write(bp, &hextable[v], 1) != 1) {
          return 0;
        }
        z = 1;
      }
    }
  }
  return 1;
}